

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

Var Js::JavascriptObject::EntryIs(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RecyclableObject *aLeft;
  RecyclableObject *aRight;
  Var pvVar5;
  int in_stack_00000010;
  undefined1 local_30 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x614,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cf40e8;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_30 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_30,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x617,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00cf40e8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (((ulong)local_30 & 0xfffffe) == 0) {
    aLeft = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
  }
  else {
    aLeft = (RecyclableObject *)Arguments::operator[]((Arguments *)local_30,1);
  }
  if ((local_30._0_4_ & 0xffffff) < 3) {
    aRight = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
  }
  else {
    aRight = (RecyclableObject *)Arguments::operator[]((Arguments *)local_30,2);
  }
  bVar3 = JavascriptConversion::SameValueCommon<false>(aLeft,aRight);
  pvVar5 = JavascriptBoolean::ToVar((uint)bVar3,pSVar1);
  return pvVar5;
}

Assistant:

Var JavascriptObject::EntryIs(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    Var x = args.Info.Count > 1 ? args[1] : scriptContext->GetLibrary()->GetUndefined();
    Var y = args.Info.Count > 2 ? args[2] : scriptContext->GetLibrary()->GetUndefined();

    return JavascriptBoolean::ToVar(JavascriptConversion::SameValue(x, y), scriptContext);
}